

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_parser.c
# Opt level: O2

gnode_t * parse_statement(gravity_parser_t *parser)

{
  gravity_lexer_t *pgVar1;
  size_t sVar2;
  gtoken_s token_00;
  gtoken_s token_01;
  gtoken_s token_02;
  gtoken_s token_03;
  _Bool _Var3;
  _Bool _Var4;
  gtoken_t gVar5;
  gnode_t *pgVar6;
  gnode_t *pgVar7;
  gnode_t *pgVar8;
  gnode_t *pgVar9;
  gtoken_s token;
  int local_4c;
  int local_44;
  
  gVar5 = gravity_lexer_peek(parser->lexer->p[parser->lexer->n - 1]);
  _Var3 = token_iserror(gVar5);
  if (_Var3) {
    parse_error(parser);
    return (gnode_t *)0x0;
  }
  _Var3 = token_islabel_statement(gVar5);
  if (_Var3) {
    pgVar1 = parser->lexer->p[parser->lexer->n - 1];
    gVar5 = gravity_lexer_next(pgVar1);
    gravity_lexer_token(pgVar1);
    if (gVar5 == TOK_KEY_DEFAULT) {
      pgVar6 = (gnode_t *)0x0;
    }
    else {
      if (gVar5 != TOK_KEY_CASE) {
        __assert_fail("(type == TOK_KEY_CASE) || (type == TOK_KEY_DEFAULT)",
                      "/workspace/llm4binary/github/license_c_cmakelists/marcobambini[P]gravity/src/compiler/gravity_parser.c"
                      ,0x862,"gnode_t *parse_label_statement(gravity_parser_t *)");
      }
      pgVar6 = parse_expression(parser);
    }
    parse_required(parser,TOK_OP_COLON);
    pgVar8 = parse_statement(parser);
    sVar2 = parser->declarations->n;
    if (sVar2 == 0) {
      pgVar7 = (gnode_t *)0x0;
    }
    else {
      pgVar7 = parser->declarations->p[sVar2 - 1];
    }
    token_00.lineno = token.lineno;
    token_00.type = token.type;
    token_00.colno = token.colno;
    token_00.position = token.position;
    token_00.bytes = token.bytes;
    token_00.length = token.length;
    token_00.fileid = token.fileid;
    token_00.builtin = token.builtin;
    token_00.value = token.value;
    pgVar6 = gnode_label_stat_create(token_00,pgVar6,pgVar8,pgVar7);
    return pgVar6;
  }
  _Var3 = token_isflow_statement(gVar5);
  if (_Var3) {
    pgVar1 = parser->lexer->p[parser->lexer->n - 1];
    gVar5 = gravity_lexer_next(pgVar1);
    gravity_lexer_token(pgVar1);
    if ((gVar5 | TOK_COMMENT) != TOK_KEY_SWITCH) {
      __assert_fail("(type == TOK_KEY_IF) || (type == TOK_KEY_SWITCH)",
                    "/workspace/llm4binary/github/license_c_cmakelists/marcobambini[P]gravity/src/compiler/gravity_parser.c"
                    ,0x87a,"gnode_t *parse_flow_statement(gravity_parser_t *)");
    }
    parse_required(parser,TOK_OP_OPEN_PARENTHESIS);
    pgVar6 = parse_expression(parser);
    parse_required(parser,TOK_OP_CLOSED_PARENTHESIS);
    pgVar8 = parse_statement(parser);
    if ((gVar5 == TOK_KEY_IF) && (gVar5 = gravity_lexer_peek(pgVar1), gVar5 == TOK_KEY_ELSE)) {
      gravity_lexer_next(pgVar1);
      pgVar7 = parse_statement(parser);
    }
    else {
      pgVar7 = (gnode_t *)0x0;
    }
    gravity_lexer_token(pgVar1);
    sVar2 = parser->declarations->n;
    if (sVar2 == 0) {
      pgVar9 = (gnode_t *)0x0;
    }
    else {
      pgVar9 = parser->declarations->p[sVar2 - 1];
    }
    token_01.lineno = token.lineno;
    token_01.type = token.type;
    token_01.colno = token.colno;
    token_01.position = token.position;
    token_01.bytes = token.bytes;
    token_01.length = token.length;
    token_01.fileid = token.fileid;
    token_01.builtin = token.builtin;
    token_01.value = token.value;
    pgVar6 = gnode_flow_stat_create
                       (token_01,pgVar6,pgVar8,pgVar7,pgVar9,(local_44 + local_4c) - token.position)
    ;
    return pgVar6;
  }
  _Var3 = token_isloop_statement(gVar5);
  if (_Var3) {
    pgVar1 = parser->lexer->p[parser->lexer->n - 1];
    gVar5 = gravity_lexer_next(pgVar1);
    gravity_lexer_token(pgVar1);
    if (2 < gVar5 - TOK_KEY_WHILE) {
      __assert_fail("(type == TOK_KEY_WHILE) || (type == TOK_KEY_REPEAT) || (type == TOK_KEY_FOR)",
                    "/workspace/llm4binary/github/license_c_cmakelists/marcobambini[P]gravity/src/compiler/gravity_parser.c"
                    ,0x8a2,"gnode_t *parse_loop_statement(gravity_parser_t *)");
    }
    if (gVar5 == TOK_KEY_FOR) {
      _Var3 = parse_optional(parser,TOK_OP_OPEN_PARENTHESIS);
      gVar5 = gravity_lexer_peek(pgVar1);
      _Var4 = token_isvariable_declaration(gVar5);
      if (_Var4) {
        pgVar6 = parse_variable_declaration(parser,false,TOK_EOF,TOK_EOF);
      }
      else {
        pgVar6 = parse_expression(parser);
      }
      parse_required(parser,TOK_KEY_IN);
      pgVar8 = parse_expression(parser);
      if (_Var3) {
        parse_required(parser,TOK_OP_CLOSED_PARENTHESIS);
      }
      pgVar7 = parse_statement(parser);
    }
    else if (gVar5 == TOK_KEY_REPEAT) {
      pgVar7 = parse_statement(parser);
      parse_required(parser,TOK_KEY_WHILE);
      _Var3 = parse_optional(parser,TOK_OP_OPEN_PARENTHESIS);
      pgVar8 = parse_expression(parser);
      if (_Var3) {
        parse_required(parser,TOK_OP_CLOSED_PARENTHESIS);
      }
      parse_semicolon(parser);
      pgVar6 = (gnode_t *)0x0;
    }
    else {
      _Var3 = parse_optional(parser,TOK_OP_OPEN_PARENTHESIS);
      pgVar6 = parse_expression(parser);
      if (_Var3) {
        parse_required(parser,TOK_OP_CLOSED_PARENTHESIS);
      }
      pgVar7 = parse_statement(parser);
      pgVar8 = (gnode_t *)0x0;
    }
    gravity_lexer_token(pgVar1);
    sVar2 = parser->declarations->n;
    if (sVar2 == 0) {
      pgVar9 = (gnode_t *)0x0;
    }
    else {
      pgVar9 = parser->declarations->p[sVar2 - 1];
    }
    token_03.lineno = token.lineno;
    token_03.type = token.type;
    token_03.colno = token.colno;
    token_03.position = token.position;
    token_03.bytes = token.bytes;
    token_03.length = token.length;
    token_03.fileid = token.fileid;
    token_03.builtin = token.builtin;
    token_03.value = token.value;
    pgVar6 = gnode_loop_stat_create
                       (token_03,pgVar6,pgVar7,pgVar8,pgVar9,(local_44 + local_4c) - token.position)
    ;
    return pgVar6;
  }
  _Var3 = token_isjump_statement(gVar5);
  if (!_Var3) {
    _Var3 = token_iscompound_statement(gVar5);
    if (_Var3) {
      pgVar6 = parse_compound_statement(parser);
      return pgVar6;
    }
    _Var3 = token_isdeclaration_statement(gVar5);
    if (_Var3) {
      pgVar6 = parse_declaration_statement(parser);
      return pgVar6;
    }
    _Var3 = token_isempty_statement(gVar5);
    if (_Var3) {
      pgVar6 = parse_empty_statement(parser);
      return pgVar6;
    }
    _Var3 = token_isimport_statement(gVar5);
    if (_Var3) {
      gravity_lexer_next(parser->lexer->p[parser->lexer->n - 1]);
      return (gnode_t *)0x0;
    }
    _Var3 = token_isspecial_statement(gVar5);
    if (_Var3) {
      pgVar1 = parser->lexer->p[parser->lexer->n - 1];
      gVar5 = gravity_lexer_next(pgVar1);
      if (gVar5 != TOK_SPECIAL) {
        __assert_fail("type == TOK_SPECIAL",
                      "/workspace/llm4binary/github/license_c_cmakelists/marcobambini[P]gravity/src/compiler/gravity_parser.c"
                      ,0x9ab,"gnode_t *parse_special_statement(gravity_parser_t *)");
      }
      parse_identifier(parser);
      gravity_lexer_token(pgVar1);
      report_error(parser,GRAVITY_WARNING,0x14392b,
                   "Unknown special token. Declaration will be ignored.");
      return (gnode_t *)0x0;
    }
    _Var3 = token_ismacro(gVar5);
    if (_Var3) {
      parse_macro_statement(parser);
      return (gnode_t *)0x0;
    }
    pgVar6 = parse_expression(parser);
    parse_semicolon(parser);
    return pgVar6;
  }
  pgVar1 = parser->lexer->p[parser->lexer->n - 1];
  gVar5 = gravity_lexer_next(pgVar1);
  gravity_lexer_token(pgVar1);
  if (1 < gVar5 - TOK_KEY_BREAK) {
    if (gVar5 != TOK_KEY_RETURN) {
      __assert_fail("(type == TOK_KEY_BREAK) || (type == TOK_KEY_CONTINUE) || (type == TOK_KEY_RETURN)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/marcobambini[P]gravity/src/compiler/gravity_parser.c"
                    ,0x8f7,"gnode_t *parse_jump_statement(gravity_parser_t *)");
    }
    gVar5 = gravity_lexer_peek(pgVar1);
    if ((gVar5 != TOK_OP_SEMICOLON) &&
       (gVar5 = gravity_lexer_peek(pgVar1), gVar5 != TOK_OP_CLOSED_CURLYBRACE)) {
      pgVar6 = parse_expression(parser);
      goto LAB_0011948e;
    }
  }
  pgVar6 = (gnode_t *)0x0;
LAB_0011948e:
  parse_semicolon(parser);
  sVar2 = parser->declarations->n;
  if (sVar2 == 0) {
    pgVar8 = (gnode_t *)0x0;
  }
  else {
    pgVar8 = parser->declarations->p[sVar2 - 1];
  }
  token_02.lineno = token.lineno;
  token_02.type = token.type;
  token_02.colno = token.colno;
  token_02.position = token.position;
  token_02.bytes = token.bytes;
  token_02.length = token.length;
  token_02.fileid = token.fileid;
  token_02.builtin = token.builtin;
  token_02.value = token.value;
  pgVar6 = gnode_jump_stat_create(token_02,pgVar6,pgVar8);
  return pgVar6;
}

Assistant:

static gnode_t *parse_statement (gravity_parser_t *parser) {
    DEBUG_PARSER("parse_statement");

    // label_statement
    // flow_statement
    // loop_statement
    // jump_statement
    // compound_statement
    // declaration_statement
    // empty_statement
    // import_statement
    // expression_statement (default)

    DECLARE_LEXER;
    gtoken_t token = gravity_lexer_peek(lexer);
    if (token_iserror(token)) return parse_error(parser);

    if (token_islabel_statement(token)) return parse_label_statement(parser);
    else if (token_isflow_statement(token)) return parse_flow_statement(parser);
    else if (token_isloop_statement(token)) return parse_loop_statement(parser);
    else if (token_isjump_statement(token)) return parse_jump_statement(parser);
    else if (token_iscompound_statement(token)) return parse_compound_statement(parser);
    else if (token_isdeclaration_statement(token)) return parse_declaration_statement(parser);
    else if (token_isempty_statement(token)) return parse_empty_statement(parser);
    else if (token_isimport_statement(token)) return parse_import_statement(parser);
    else if (token_isspecial_statement(token)) return parse_special_statement(parser);
    else if (token_ismacro(token)) return parse_macro_statement(parser);

    return parse_expression_statement(parser); // DEFAULT
}